

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O0

bool __thiscall
iDynTree::InverseKinematics::getFullJointsSolution
          (InverseKinematics *this,MatrixView<double> *baseTransformSolution,
          Span<double,__1L> shapeSolution)

{
  bool bVar1;
  
  bVar1 = missingIpoptErrorReport();
  return bVar1;
}

Assistant:

bool InverseKinematics::getFullJointsSolution(iDynTree::MatrixView<double> baseTransformSolution,
                                                  iDynTree::Span<double> shapeSolution)
    {
#ifdef IDYNTREE_USES_IPOPT
        bool ok = shapeSolution.size() == IK_PIMPL(m_pimpl)->m_dofs;
        if (!ok)
        {
            reportError("InveseKineamtics",
                        "getFullJointsSolution",
                        "Invalid size of the shapeSolution vector");
            return false;
        }

        constexpr int expected_transform_cols = 4;
        constexpr int expected_transform_rows = 4;
        ok = (baseTransformSolution.rows() == expected_transform_rows)
            && (baseTransformSolution.cols() == expected_transform_cols);
        if (!ok)
        {
            reportError("InverseKinematics",
                        "getFullJointsSolution",
                        "Invalid size of the baseTransformSolution vector");
            return false;
        }

        toEigen(baseTransformSolution) = toEigen(IK_PIMPL(m_pimpl)->m_baseResults.asHomogeneousTransform());
        toEigen(shapeSolution)         = toEigen(IK_PIMPL(m_pimpl)->m_jointsResults);
        return true;
#else
        return missingIpoptErrorReport();
#endif
    }